

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cMultiBindTests.cpp
# Opt level: O3

void gl4cts::MultiBind::checkBinding
               (Context *context,GLenum pname,GLuint index,string *target_name,GLint expected_value)

{
  ostringstream *this;
  string *psVar1;
  int iVar2;
  deUint32 err;
  undefined4 extraout_var;
  TestError *this_00;
  GLint binding;
  int local_1bc;
  string *local_1b8;
  undefined1 local_1b0 [120];
  ios_base local_138 [264];
  
  local_1b8 = target_name;
  iVar2 = (*context->m_renderCtx->_vptr_RenderContext[3])();
  local_1bc = -1;
  (**(code **)(CONCAT44(extraout_var,iVar2) + 0x860))(pname,index,&local_1bc);
  err = (**(code **)(CONCAT44(extraout_var,iVar2) + 0x800))();
  glu::checkError(err,"GetIntegeri_v",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cMultiBindTests.cpp"
                  ,0x582);
  psVar1 = local_1b8;
  if (local_1bc == expected_value) {
    return;
  }
  local_1b0._0_8_ = context->m_testCtx->m_log;
  this = (ostringstream *)(local_1b0 + 8);
  std::__cxx11::ostringstream::ostringstream(this);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,"Invalid binding: ",0x11);
  std::ostream::operator<<(this,local_1bc);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,", expected: ",0xc);
  std::ostream::operator<<(this,expected_value);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,". Target: ",10);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this,(psVar1->_M_dataplus)._M_p,psVar1->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this," at index: ",0xb);
  std::ostream::_M_insert<unsigned_long>((ulong)this);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(this);
  std::ios_base::~ios_base(local_138);
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_00,"Invalid binding",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cMultiBindTests.cpp"
             ,0x589);
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void checkBinding(deqp::Context& context, GLenum pname, GLuint index, const std::string& target_name,
				  GLint expected_value)
{
	const Functions& gl = context.getRenderContext().getFunctions();

	GLint binding = -1;

	gl.getIntegeri_v(pname, index, &binding);
	GLU_EXPECT_NO_ERROR(gl.getError(), "GetIntegeri_v");

	if (binding != expected_value)
	{
		context.getTestContext().getLog() << tcu::TestLog::Message << "Invalid binding: " << binding
										  << ", expected: " << expected_value << ". Target: " << target_name
										  << " at index: " << index << tcu::TestLog::EndMessage;
		TCU_FAIL("Invalid binding");
	}
}